

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demand_queue.hpp
# Opt level: O1

void __thiscall
so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t::push
          (demand_queue_t *this,queue_for_one_priority_t *subqueue,demand_unique_ptr_t *demand)

{
  _Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false> _Var1;
  demand_t *pdVar2;
  pointer *__ptr;
  demand_t **ppdVar3;
  
  _Var1._M_head_impl =
       (this->m_lock)._M_t.
       super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
       .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_lock_t[2])(_Var1._M_head_impl);
  pdVar2 = (demand->_M_t).
           super___uniq_ptr_impl<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
           .
           super__Head_base<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_false>
           ._M_head_impl;
  (demand->_M_t).
  super___uniq_ptr_impl<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
  .super__Head_base<0UL,_so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t_*,_false>.
  _M_head_impl = (demand_t *)0x0;
  ppdVar3 = &subqueue->m_tail->m_next;
  if (subqueue->m_tail == (demand_t *)0x0) {
    ppdVar3 = &subqueue->m_head;
  }
  *ppdVar3 = pdVar2;
  subqueue->m_tail = pdVar2;
  LOCK();
  (subqueue->m_demands_count).super___atomic_base<unsigned_long>._M_i =
       (subqueue->m_demands_count).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  if (this->m_current_priority == (queue_for_one_priority_t *)0x0) {
    this->m_current_priority = subqueue;
    (*(_Var1._M_head_impl)->_vptr_lock_t[5])(_Var1._M_head_impl);
  }
  else if (this->m_current_priority < subqueue) {
    this->m_current_priority = subqueue;
  }
  (*(_Var1._M_head_impl)->_vptr_lock_t[3])(_Var1._M_head_impl);
  return;
}

Assistant:

void
		push(
			//! Subqueue for the demand.
			queue_for_one_priority_t * subqueue,
			//! Demand to be pushed.
			demand_unique_ptr_t demand )
			{
				queue_traits::lock_guard_t lock{ *m_lock };

				add_demand_to_queue( *subqueue, std::move( demand ) );

				if( !m_current_priority )
					{
						// Queue was empty. A sleeping working thread must
						// be notified.
						m_current_priority = subqueue;
						lock.notify_one();
					}
				else if( m_current_priority < subqueue )
					// New demand has greater priority than the previous.
					m_current_priority = subqueue;
			}